

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

int P_Thing_Damage(int tid,AActor *whofor0,int amount,FName *type)

{
  AActor *target;
  uint uVar1;
  int iVar2;
  int iVar3;
  AActor *local_78;
  AActor *local_70;
  TAngle<double> local_60;
  FName local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  AActor *local_50;
  AActor *next;
  AActor *actor;
  undefined1 local_38 [4];
  int count;
  FActorIterator iterator;
  FName *type_local;
  int amount_local;
  AActor *whofor0_local;
  int tid_local;
  
  iterator._8_8_ = type;
  FActorIterator::FActorIterator((FActorIterator *)local_38,tid);
  actor._4_4_ = 0;
  local_70 = whofor0;
  if (tid != 0) {
    local_70 = FActorIterator::Next((FActorIterator *)local_38);
  }
  next = local_70;
  while (next != (AActor *)0x0) {
    if (tid == 0) {
      local_78 = (AActor *)0x0;
    }
    else {
      local_78 = FActorIterator::Next((FActorIterator *)local_38);
    }
    local_50 = local_78;
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_54,
               (int)next +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
    target = next;
    if (uVar1 != 0) {
      if (amount < 1) {
        iVar3 = next->health;
        iVar2 = AActor::SpawnHealth(next);
        if (iVar3 < iVar2) {
          next->health = next->health - amount;
          iVar3 = next->health;
          iVar2 = AActor::SpawnHealth(next);
          if (iVar2 < iVar3) {
            iVar3 = AActor::SpawnHealth(next);
            next->health = iVar3;
          }
          if (next->player != (player_t *)0x0) {
            next->player->health = next->health;
          }
        }
      }
      else {
        FName::FName(&local_58,type);
        TAngle<double>::TAngle(&local_60,0.0);
        P_DamageMobj(target,(AActor *)0x0,whofor0,amount,&local_58,0,&local_60);
      }
      actor._4_4_ = actor._4_4_ + 1;
    }
    next = local_50;
  }
  return actor._4_4_;
}

Assistant:

int P_Thing_Damage (int tid, AActor *whofor0, int amount, FName type)
{
	FActorIterator iterator (tid);
	int count = 0;
	AActor *actor;

	actor = (tid == 0 ? whofor0 : iterator.Next());
	while (actor)
	{
		AActor *next = tid == 0 ? NULL : iterator.Next ();
		if (actor->flags & MF_SHOOTABLE)
		{
			if (amount > 0)
			{
				P_DamageMobj (actor, NULL, whofor0, amount, type);
			}
			else if (actor->health < actor->SpawnHealth())
			{
				actor->health -= amount;
				if (actor->health > actor->SpawnHealth())
				{
					actor->health = actor->SpawnHealth();
				}
				if (actor->player != NULL)
				{
					actor->player->health = actor->health;
				}
			}
			count++;
		}
		actor = next;
	}
	return count;
}